

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeTripAllCursors(Btree *pBtree,int errCode,int writeOnly)

{
  int *piVar1;
  int errCode_00;
  BtCursor *pCur;
  
  if (pBtree == (Btree *)0x0) {
    errCode_00 = 0;
  }
  else {
    if ((pBtree->sharable != '\0') &&
       (pBtree->wantToLock = pBtree->wantToLock + 1, pBtree->locked == '\0')) {
      btreeLockCarefully(pBtree);
    }
    for (pCur = pBtree->pBt->pCursor; errCode_00 = 0, pCur != (BtCursor *)0x0; pCur = pCur->pNext) {
      if ((writeOnly == 0) || ((pCur->curFlags & 1) != 0)) {
        sqlite3_free(pCur->pKey);
        pCur->pKey = (void *)0x0;
        pCur->eState = '\x04';
        pCur->skipNext = errCode;
      }
      else if ((pCur->eState & 0xfd) == 0) {
        errCode_00 = saveCursorPosition(pCur);
        if (errCode_00 != 0) {
          sqlite3BtreeTripAllCursors(pBtree,errCode_00,0);
          break;
        }
      }
      btreeReleaseAllCursorPages(pCur);
    }
    if (pBtree->sharable != '\0') {
      piVar1 = &pBtree->wantToLock;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        unlockBtreeMutex(pBtree);
      }
    }
  }
  return errCode_00;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeTripAllCursors(Btree *pBtree, int errCode, int writeOnly){
  BtCursor *p;
  int rc = SQLITE_OK;

  assert( (writeOnly==0 || writeOnly==1) && BTCF_WriteFlag==1 );
  if( pBtree ){
    sqlite3BtreeEnter(pBtree);
    for(p=pBtree->pBt->pCursor; p; p=p->pNext){
      if( writeOnly && (p->curFlags & BTCF_WriteFlag)==0 ){
        if( p->eState==CURSOR_VALID || p->eState==CURSOR_SKIPNEXT ){
          rc = saveCursorPosition(p);
          if( rc!=SQLITE_OK ){
            (void)sqlite3BtreeTripAllCursors(pBtree, rc, 0);
            break;
          }
        }
      }else{
        sqlite3BtreeClearCursor(p);
        p->eState = CURSOR_FAULT;
        p->skipNext = errCode;
      }
      btreeReleaseAllCursorPages(p);
    }
    sqlite3BtreeLeave(pBtree);
  }
  return rc;
}